

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

string * __thiscall
pbrt::PiecewiseConstant1D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseConstant1D *this)

{
  float *in_stack_fffffffffffffff0;
  
  StringPrintf<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ PiecewiseConstant1D func: %s cdf: %s min: %f max: %f funcInt: %f ]",
             (char *)this,&this->cdf,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&this->min,&this->max,
             &this->funcInt,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ PiecewiseConstant1D func: %s cdf: %s "
                            "min: %f max: %f funcInt: %f ]",
                            func, cdf, min, max, funcInt);
    }